

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_file.c
# Opt level: O0

int nni_plat_file_put(char *name,void *data,size_t len)

{
  char *pcVar1;
  FILE *__s;
  int *piVar2;
  size_t sVar3;
  int local_34;
  int rv;
  FILE *f;
  size_t len_local;
  void *data_local;
  char *name_local;
  
  local_34 = 0;
  pcVar1 = strchr(name,0x2f);
  if ((pcVar1 == (char *)0x0) ||
     (local_34 = nni_plat_make_parent_dirs(name), name_local._4_4_ = local_34, local_34 == 0)) {
    __s = fopen(name,"wb");
    if (__s == (FILE *)0x0) {
      piVar2 = __errno_location();
      name_local._4_4_ = nni_plat_errno(*piVar2);
    }
    else {
      sVar3 = fwrite(data,1,len,__s);
      if (sVar3 != len) {
        piVar2 = __errno_location();
        local_34 = nni_plat_errno(*piVar2);
        unlink(name);
      }
      fclose(__s);
      name_local._4_4_ = local_34;
    }
  }
  return name_local._4_4_;
}

Assistant:

int
nni_plat_file_put(const char *name, const void *data, size_t len)
{
	FILE *f;
	int   rv = 0;

	// It is possible that the name contains a directory path
	// that does not exist.  In this case we try to create the
	// entire tree.
	if (strchr(name, '/') != NULL) {
		if ((rv = nni_plat_make_parent_dirs(name)) != 0) {
			return (rv);
		}
	}

	if ((f = fopen(name, "wb")) == NULL) {
		return (nni_plat_errno(errno));
	}
	if (fwrite(data, 1, len, f) != len) {
		rv = nni_plat_errno(errno);
		(void) unlink(name);
	}
	(void) fclose(f);
	return (rv);
}